

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skip_list.c
# Opt level: O2

ion_sl_node_t * sl_find_node(ion_skiplist_t *skiplist,ion_key_t key)

{
  ion_key_size_t iVar1;
  ion_sl_node_t *piVar2;
  char cVar3;
  ion_sl_node_t *piVar4;
  uint uVar5;
  
  iVar1 = (skiplist->super).record.key_size;
  piVar4 = skiplist->head;
  uVar5 = piVar4->height;
  do {
    if ((int)uVar5 < 0) {
      return piVar4;
    }
    piVar2 = piVar4;
    while ((piVar4 = piVar2, piVar4->next[uVar5] != (sl_node *)0x0 &&
           (cVar3 = (*(skiplist->super).compare)(piVar4->next[uVar5]->key,key,iVar1), cVar3 < '\x01'
           ))) {
      piVar2 = (ion_sl_node_t *)0x0;
      if (piVar4->next[uVar5] != (sl_node *)0x0) {
        cVar3 = (*(skiplist->super).compare)(piVar4->next[uVar5]->key,key,iVar1);
        piVar2 = piVar4->next[uVar5];
        if (cVar3 == '\0') {
          return piVar4->next[uVar5];
        }
      }
    }
    uVar5 = uVar5 - 1;
  } while( true );
}

Assistant:

ion_sl_node_t *
sl_find_node(
	ion_skiplist_t	*skiplist,
	ion_key_t		key
) {
	int				key_size	= skiplist->super.record.key_size;
	ion_sl_node_t	*cursor		= skiplist->head;
	ion_sl_level_t	h;

	for (h = skiplist->head->height; h >= 0; h--) {
		while (NULL != cursor->next[h] && skiplist->super.compare(cursor->next[h]->key, key, key_size) <= 0) {
			if ((NULL != cursor->next[h]) && (skiplist->super.compare(cursor->next[h]->key, key, key_size) == 0)) {
				return cursor->next[h];
			}

			cursor = cursor->next[h];
		}
	}

	/* Key was not found, so return closest thing to that key */
	return cursor;
}